

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O2

void mp::
     WriteFlatCon<fmt::BasicMemoryWriter<char,std::allocator<char>>,mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::AtanId>>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,
               CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AtanId>
               *c,ItemNamer *vnam)

{
  char *__s;
  size_t sVar1;
  BasicWriter<char> *this;
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  
  __s = (c->super_FunctionalConstraint).super_BasicConstraint.name_._M_dataplus._M_p;
  sVar1 = strlen(__s);
  value.size_ = sVar1;
  value.data_ = __s;
  this = fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,value);
  value_00.size_ = 2;
  value_00.data_ = ": ";
  fmt::BasicWriter<char>::operator<<(this,value_00);
  WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::AtanId>
            (wrt,c,vnam);
  return;
}

Assistant:

inline void WriteFlatCon(Writer& wrt, const Con& c,
                  ItemNamer& vnam) {
  wrt << c.name() << ": ";
  WriteModelItem(wrt, c, vnam);
}